

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void cmSourceFileSetName2(void *arg,char *name,char *dir,char *ext,int headerFileOnly)

{
  bool bVar1;
  string local_d8;
  undefined1 local_b8 [8];
  string fname;
  string local_90;
  allocator<char> local_59;
  string local_58;
  void *local_38;
  cmCPluginAPISourceFile *sf;
  char *pcStack_28;
  int headerFileOnly_local;
  char *ext_local;
  char *dir_local;
  char *name_local;
  void *arg_local;
  
  if (*arg == 0) {
    local_38 = arg;
    sf._4_4_ = headerFileOnly;
    pcStack_28 = ext;
    ext_local = dir;
    dir_local = name;
    name_local = (char *)arg;
    if (headerFileOnly != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"HEADER_FILE_ONLY",&local_59);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"1",(allocator<char> *)(fname.field_2._M_local_buf + 0xf));
      cmPropertyMap::SetProperty((cmPropertyMap *)((long)arg + 0x80),&local_58,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator((allocator<char> *)(fname.field_2._M_local_buf + 0xf));
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator(&local_59);
    }
    std::__cxx11::string::operator=((string *)((long)local_38 + 8),dir_local);
    std::__cxx11::string::string((string *)local_b8,(string *)((long)local_38 + 8));
    bVar1 = cmNonempty(pcStack_28);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)local_b8,".");
      std::__cxx11::string::operator+=((string *)local_b8,pcStack_28);
    }
    cmsys::SystemTools::CollapseFullPath(&local_d8,(string *)local_b8,ext_local);
    std::__cxx11::string::operator=((string *)((long)local_38 + 0x48),(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    cmsys::SystemTools::ConvertToUnixSlashes((string *)((long)local_38 + 0x48));
    std::__cxx11::string::operator=((string *)((long)local_38 + 0x28),pcStack_28);
    std::__cxx11::string::~string((string *)local_b8);
  }
  return;
}

Assistant:

static void CCONV cmSourceFileSetName2(void* arg, const char* name,
                                       const char* dir, const char* ext,
                                       int headerFileOnly)
{
  cmCPluginAPISourceFile* sf = static_cast<cmCPluginAPISourceFile*>(arg);
  if (sf->RealSourceFile) {
    // SetName is allowed only on temporary source files created by
    // the command for building and passing to AddSource.
    return;
  }

  // Implement the old SetName method code here.
  if (headerFileOnly) {
    sf->Properties.SetProperty("HEADER_FILE_ONLY", "1");
  }
  sf->SourceName = name;
  std::string fname = sf->SourceName;
  if (cmNonempty(ext)) {
    fname += ".";
    fname += ext;
  }
  sf->FullPath = cmSystemTools::CollapseFullPath(fname, dir);
  cmSystemTools::ConvertToUnixSlashes(sf->FullPath);
  sf->SourceExtension = ext;
}